

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCraneRailAShapeProfileDef::~IfcCraneRailAShapeProfileDef
          (IfcCraneRailAShapeProfileDef *this,void **vtt)

{
  void **vtt_local;
  IfcCraneRailAShapeProfileDef *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCraneRailAShapeProfileDef,_12UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCraneRailAShapeProfileDef,_12UL> *)
             &(this->super_IfcParameterizedProfileDef).field_0x70,vtt + 10);
  IfcParameterizedProfileDef::~IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,vtt + 1);
  return;
}

Assistant:

IfcCraneRailAShapeProfileDef() : Object("IfcCraneRailAShapeProfileDef") {}